

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase141::run(TestCase141 *this)

{
  bool bVar1;
  bool bVar2;
  undefined4 *puVar3;
  UnwindDetector _kjUnwindDetector146;
  UnwindDetector _kjUnwindDetector147;
  UnwindDetector local_30;
  UnwindDetector local_2c;
  
  UnwindDetector::UnwindDetector(&local_30);
  UnwindDetector::UnwindDetector(&local_2c);
  bVar1 = UnwindDetector::isUnwinding(&local_2c);
  bVar2 = UnwindDetector::isUnwinding(&local_30);
  if ((bVar2) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[25]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x99,ERROR,"\"failed: expected \" \"success\"",
               (char (*) [25])"failed: expected success");
  }
  if (bVar1 && Debug::minSeverity < 3) {
    Debug::log<char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x9a,ERROR,"\"failed: expected \" \"!(failure)\"",
               (char (*) [28])"failed: expected !(failure)");
  }
  UnwindDetector::UnwindDetector(&local_30);
  UnwindDetector::UnwindDetector(&local_2c);
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 1;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

TEST(Exception, ScopeSuccessFail) {
  bool success = false;
  bool failure = false;

  {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);
  }

  EXPECT_TRUE(success);
  EXPECT_FALSE(failure);

  success = false;
  failure = false;

  try {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);

    throw 1;
  } catch (int) {}

  EXPECT_FALSE(success);
  EXPECT_TRUE(failure);
}